

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * CreateReturn(ExpressionContext *ctx,SynBase *source,ExprBase *result)

{
  FunctionData *function;
  bool bVar1;
  int iVar2;
  ScopeData *curr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var3;
  ScopeData *pSVar4;
  TypeFunction *pTVar5;
  TypeBase *pTVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var_02;
  ExprBase *pEVar9;
  SynBase *pSVar10;
  undefined4 extraout_var_03;
  TypeBase *pTVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TypeError *pTVar12;
  TypeBase *local_38;
  ExprBase *pEVar8;
  undefined4 extraout_var_01;
  
  pTVar11 = result->type;
  if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0)) {
    for (pSVar4 = ctx->scope; (pSVar4 != (ScopeData *)0x0 && (pSVar4->ownerType == (TypeBase *)0x0))
        ; pSVar4 = pSVar4->scope) {
      function = pSVar4->ownerFunction;
      if (function != (FunctionData *)0x0) {
        pTVar11 = function->type->returnType;
        if (pTVar11 == ctx->typeAuto) {
          bVar1 = AssertValueExpression(ctx,source,result);
          if (!bVar1) {
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_04,iVar2);
            local_38 = ctx->typeVoid;
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            pp_Var3 = (_func_int **)CONCAT44(extraout_var_05,iVar2);
            pSVar10 = result->source;
            pTVar12 = ExpressionContext::GetErrorType(ctx);
            *(undefined4 *)(pp_Var3 + 1) = 0;
            pp_Var3[2] = (_func_int *)pSVar10;
            pp_Var3[3] = (_func_int *)pTVar12;
            pp_Var3[4] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var3 + 5) = 0;
            *pp_Var3 = (_func_int *)&PTR__ExprError_003e6630;
            pp_Var3[0xc] = (_func_int *)0x0;
            pp_Var3[6] = (_func_int *)(pp_Var3 + 8);
            pp_Var3[8] = (_func_int *)result;
            pp_Var3[7] = (_func_int *)0x400000002;
            pp_Var3[9] = (_func_int *)0x0;
            pEVar7->typeID = 0x1c;
            pEVar7->source = source;
            goto LAB_001e297a;
          }
          pTVar11 = result->type;
          pTVar5 = ExpressionContext::GetFunctionType(ctx,source,pTVar11,function->type->arguments);
          function->type = pTVar5;
        }
        pTVar6 = ctx->typeVoid;
        if ((pTVar11 == ctx->typeVoid) && (pTVar6 = pTVar11, result->type != pTVar11)) {
          anon_unknown.dwarf_1117a3::Report(ctx,source,"ERROR: \'void\' function returning a value")
          ;
          pTVar6 = ctx->typeVoid;
        }
        if ((pTVar11 != pTVar6) && (result->type == pTVar6)) {
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,"ERROR: function must return a value of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)(pTVar11->name).begin));
        }
        pEVar7 = CreateCast(ctx,source,result,function->type->returnType,false);
        function->hasExplicitReturn = true;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
        pTVar11 = ctx->typeVoid;
        pEVar9 = CreateFunctionCoroutineStateUpdate(ctx,source,function,0);
        pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pSVar10 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar10,function,ctx->scope);
        pEVar8->typeID = 0x1c;
        pEVar8->source = source;
        pEVar8->type = pTVar11;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6668;
        pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar7;
        *(ExprBase **)&pEVar8[1].typeID = pEVar9;
        pEVar8[1].source = pSVar10;
        return pEVar8;
      }
    }
    if ((pTVar11 != (TypeBase *)0x0) && (pTVar11->typeID == 0x15)) {
      result = CreateCast(ctx,source,result,pTVar11,false);
    }
    bVar1 = AssertValueExpression(ctx,result->source,result);
    if (!bVar1) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
      local_38 = ctx->typeVoid;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pp_Var3 = (_func_int **)CONCAT44(extraout_var_01,iVar2);
      pSVar10 = result->source;
      pTVar12 = ExpressionContext::GetErrorType(ctx);
      *(undefined4 *)(pp_Var3 + 1) = 0;
      pp_Var3[2] = (_func_int *)pSVar10;
      pp_Var3[3] = (_func_int *)pTVar12;
      pp_Var3[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var3 + 5) = 0;
      *pp_Var3 = (_func_int *)&PTR__ExprError_003e6630;
      pp_Var3[0xc] = (_func_int *)0x0;
      pp_Var3[6] = (_func_int *)(pp_Var3 + 8);
      pp_Var3[8] = (_func_int *)result;
      pp_Var3[7] = (_func_int *)0x400000002;
      pp_Var3[9] = (_func_int *)0x0;
      pEVar7->typeID = 0x1c;
      pEVar7->source = source;
LAB_001e297a:
      pEVar7->type = local_38;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6668;
      pEVar7[1]._vptr_ExprBase = pp_Var3;
      goto LAB_001e2b7c;
    }
    pTVar11 = result->type;
    bVar1 = ExpressionContext::IsNumericType(ctx,pTVar11);
    if ((!bVar1) && ((pTVar11 == (TypeBase *)0x0 || (pTVar11->typeID != 0x19)))) {
      anon_unknown.dwarf_1117a3::Report
                (ctx,source,"ERROR: global return cannot accept \'%.*s\'",
                 (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)(pTVar11->name).begin));
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar11 = ctx->typeVoid;
  }
  else {
    pSVar4 = ctx->scope;
    while( true ) {
      if ((pSVar4 == (ScopeData *)0x0) || (pSVar4->ownerType != (TypeBase *)0x0)) goto LAB_001e2b31;
      if (pSVar4->ownerFunction != (FunctionData *)0x0) break;
      pSVar4 = pSVar4->scope;
    }
    pSVar4->ownerFunction->hasExplicitReturn = true;
LAB_001e2b31:
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
    pTVar11 = result->type;
  }
  pEVar7->typeID = 0x1c;
  pEVar7->source = source;
  pEVar7->type = pTVar11;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6668;
  pEVar7[1]._vptr_ExprBase = (_func_int **)result;
LAB_001e2b7c:
  *(undefined8 *)&pEVar7[1].typeID = 0;
  pEVar7[1].source = (SynBase *)0x0;
  return pEVar7;
}

Assistant:

ExprBase* CreateReturn(ExpressionContext &ctx, SynBase *source, ExprBase *result)
{
	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprReturn>()) ExprReturn(source, result->type, result, NULL, NULL);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, source, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(source, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, source, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, source, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, source, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));
	}

	if(isType<TypeFunction>(result->type))
		result = CreateCast(ctx, source, result, result->type, false);

	if(!AssertValueExpression(ctx, result->source, result))
		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

	if(!ctx.IsNumericType(result->type) && !isType<TypeEnum>(result->type))
		Report(ctx, source, "ERROR: global return cannot accept '%.*s'", FMT_ISTR(result->type->name));

	return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, NULL, NULL);
}